

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter.h
# Opt level: O3

void __thiscall
spdlog::details::c_formatter::format
          (c_formatter *this,log_msg *param_1,tm *tm_time,memory_buffer *dest)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  char *pcVar5;
  size_t sVar6;
  ulong uVar7;
  value_type *buf_ptr;
  scoped_pad p;
  format_int fStack_68;
  scoped_pad local_48;
  
  scoped_pad::scoped_pad(&local_48,0x18,&(this->super_flag_formatter).padinfo_,dest);
  pcVar5 = *(char **)(days + (long)tm_time->tm_wday * 8);
  sVar4 = strlen(pcVar5);
  fmt::v5::internal::basic_buffer<char>::append<char>
            (&dest->super_basic_buffer<char>,pcVar5,pcVar5 + sVar4);
  sVar6 = (dest->super_basic_buffer<char>).size_;
  uVar7 = sVar6 + 1;
  if ((dest->super_basic_buffer<char>).capacity_ < uVar7) {
    (**(dest->super_basic_buffer<char>)._vptr_basic_buffer)(dest);
    sVar6 = (dest->super_basic_buffer<char>).size_;
    uVar7 = sVar6 + 1;
  }
  (dest->super_basic_buffer<char>).size_ = uVar7;
  (dest->super_basic_buffer<char>).ptr_[sVar6] = ' ';
  pcVar5 = *(char **)(months + (long)tm_time->tm_mon * 8);
  sVar4 = strlen(pcVar5);
  fmt::v5::internal::basic_buffer<char>::append<char>
            (&dest->super_basic_buffer<char>,pcVar5,pcVar5 + sVar4);
  sVar6 = (dest->super_basic_buffer<char>).size_;
  uVar7 = sVar6 + 1;
  if ((dest->super_basic_buffer<char>).capacity_ < uVar7) {
    (**(dest->super_basic_buffer<char>)._vptr_basic_buffer)(dest);
    sVar6 = (dest->super_basic_buffer<char>).size_;
    uVar7 = sVar6 + 1;
  }
  (dest->super_basic_buffer<char>).size_ = uVar7;
  (dest->super_basic_buffer<char>).ptr_[sVar6] = ' ';
  uVar1 = tm_time->tm_mday;
  uVar3 = -uVar1;
  if (0 < (int)uVar1) {
    uVar3 = uVar1;
  }
  pcVar5 = fmt::v5::format_int::format_decimal(&fStack_68,(ulong)uVar3);
  fStack_68.str_ = pcVar5;
  if ((int)uVar1 < 0) {
    fStack_68.str_ = pcVar5 + -1;
    pcVar5[-1] = '-';
  }
  if (-0x16 < (long)&fStack_68 - (long)fStack_68.str_) {
    fmt::v5::internal::basic_buffer<char>::append<char>
              (&dest->super_basic_buffer<char>,fStack_68.str_,
               fStack_68.str_ + ((long)&fStack_68 - (long)fStack_68.str_) + 0x15);
    sVar6 = (dest->super_basic_buffer<char>).size_;
    uVar7 = sVar6 + 1;
    if ((dest->super_basic_buffer<char>).capacity_ < uVar7) {
      (**(dest->super_basic_buffer<char>)._vptr_basic_buffer)(dest);
      sVar6 = (dest->super_basic_buffer<char>).size_;
      uVar7 = sVar6 + 1;
    }
    (dest->super_basic_buffer<char>).size_ = uVar7;
    (dest->super_basic_buffer<char>).ptr_[sVar6] = ' ';
    fmt_helper::pad2<500ul>(tm_time->tm_hour,dest);
    sVar6 = (dest->super_basic_buffer<char>).size_;
    uVar7 = sVar6 + 1;
    if ((dest->super_basic_buffer<char>).capacity_ < uVar7) {
      (**(dest->super_basic_buffer<char>)._vptr_basic_buffer)(dest);
      sVar6 = (dest->super_basic_buffer<char>).size_;
      uVar7 = sVar6 + 1;
    }
    (dest->super_basic_buffer<char>).size_ = uVar7;
    (dest->super_basic_buffer<char>).ptr_[sVar6] = ':';
    fmt_helper::pad2<500ul>(tm_time->tm_min,dest);
    sVar6 = (dest->super_basic_buffer<char>).size_;
    uVar7 = sVar6 + 1;
    if ((dest->super_basic_buffer<char>).capacity_ < uVar7) {
      (**(dest->super_basic_buffer<char>)._vptr_basic_buffer)(dest);
      sVar6 = (dest->super_basic_buffer<char>).size_;
      uVar7 = sVar6 + 1;
    }
    (dest->super_basic_buffer<char>).size_ = uVar7;
    (dest->super_basic_buffer<char>).ptr_[sVar6] = ':';
    fmt_helper::pad2<500ul>(tm_time->tm_sec,dest);
    sVar6 = (dest->super_basic_buffer<char>).size_;
    uVar7 = sVar6 + 1;
    if ((dest->super_basic_buffer<char>).capacity_ < uVar7) {
      (**(dest->super_basic_buffer<char>)._vptr_basic_buffer)(dest);
      sVar6 = (dest->super_basic_buffer<char>).size_;
      uVar7 = sVar6 + 1;
    }
    (dest->super_basic_buffer<char>).size_ = uVar7;
    (dest->super_basic_buffer<char>).ptr_[sVar6] = ' ';
    iVar2 = tm_time->tm_year;
    uVar1 = iVar2 + 0x76c;
    uVar3 = -uVar1;
    if (0 < (int)uVar1) {
      uVar3 = uVar1;
    }
    pcVar5 = fmt::v5::format_int::format_decimal(&fStack_68,(ulong)uVar3);
    fStack_68.str_ = pcVar5;
    if (iVar2 < -0x76c) {
      fStack_68.str_ = pcVar5 + -1;
      pcVar5[-1] = '-';
    }
    if (-0x16 < (long)&fStack_68 - (long)fStack_68.str_) {
      fmt::v5::internal::basic_buffer<char>::append<char>
                (&dest->super_basic_buffer<char>,fStack_68.str_,
                 fStack_68.str_ + ((long)&fStack_68 - (long)fStack_68.str_) + 0x15);
      scoped_pad::~scoped_pad(&local_48);
      return;
    }
  }
  __assert_fail("(value >= 0) && \"negative value\"",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/lib/logging/spdlog/fmt/bundled/core.h"
                ,0xde,
                "typename std::make_unsigned<Int>::type fmt::internal::to_unsigned(Int) [Int = long]"
               );
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, fmt::memory_buffer &dest) override
    {
        const size_t field_size = 24;
        scoped_pad p(field_size, padinfo_, dest);

        fmt_helper::append_string_view(days[tm_time.tm_wday], dest);
        dest.push_back(' ');
        fmt_helper::append_string_view(months[tm_time.tm_mon], dest);
        dest.push_back(' ');
        fmt_helper::append_int(tm_time.tm_mday, dest);
        dest.push_back(' ');
        // time

        fmt_helper::pad2(tm_time.tm_hour, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_min, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_sec, dest);
        dest.push_back(' ');
        fmt_helper::append_int(tm_time.tm_year + 1900, dest);
    }